

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateDestructorCode
          (StringFieldGenerator *this,Printer *printer)

{
  Printer *in_RDI;
  Formatter format;
  Formatter *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffd8;
  Formatter *in_stack_ffffffffffffffe0;
  
  Formatter::Formatter
            (in_stack_ffffffffffffffa0,in_RDI,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x57231a);
  if ((in_RDI->failed_ & 1U) == 0) {
    Formatter::operator()<>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  Formatter::~Formatter((Formatter *)0x572353);
  return;
}

Assistant:

void StringFieldGenerator::GenerateDestructorCode(io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (inlined_) {
    // The destructor is automatically invoked.
    return;
  }

  format("$name$_.DestroyNoArena($default_variable$);\n");
}